

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_value.cpp
# Opt level: O0

void duckdb::ListValueFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  VectorType VVar1;
  PhysicalType PVar2;
  idx_t iVar3;
  list_entry_t *plVar4;
  reference this;
  Vector *this_00;
  LogicalType *this_01;
  Vector *in_RDX;
  LogicalType *result_type;
  idx_t i;
  list_entry_t *result_data;
  Vector *in_stack_00000048;
  DataChunk *in_stack_00000050;
  Vector *in_stack_00000058;
  DataChunk *in_stack_00000060;
  Vector *in_stack_00000068;
  DataChunk *in_stack_00000070;
  Vector *in_stack_00000078;
  DataChunk *in_stack_00000080;
  Vector *in_stack_000001a8;
  DataChunk *in_stack_000001b0;
  size_type in_stack_ffffffffffffffb8;
  vector<duckdb::Vector,_true> *in_stack_ffffffffffffffc0;
  ulong local_28;
  
  duckdb::Vector::SetVectorType((VectorType)in_RDX);
  iVar3 = DataChunk::ColumnCount((DataChunk *)0xd4ca2c);
  if (iVar3 == 0) {
    plVar4 = FlatVector::GetData<duckdb::list_entry_t>((Vector *)0xd4ca3c);
    plVar4->length = 0;
    plVar4->offset = 0;
  }
  else {
    for (local_28 = 0; iVar3 = DataChunk::ColumnCount((DataChunk *)0xd4ca7c), local_28 < iVar3;
        local_28 = local_28 + 1) {
      this = vector<duckdb::Vector,_true>::operator[]
                       (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      VVar1 = Vector::GetVectorType(this);
      if (VVar1 != CONSTANT_VECTOR) {
        duckdb::Vector::SetVectorType((VectorType)in_RDX);
      }
    }
    this_00 = (Vector *)duckdb::ListVector::GetEntry(in_RDX);
    this_01 = Vector::GetType(this_00);
    PVar2 = LogicalType::InternalType(this_01);
    switch(PVar2) {
    case BOOL:
    case INT8:
      TemplatedListValueFunction<signed_char,duckdb::ListValueAssign>
                (in_stack_00000060,in_stack_00000058);
      break;
    case UINT8:
      TemplatedListValueFunction<unsigned_char,duckdb::ListValueAssign>
                (in_stack_00000050,in_stack_00000048);
      break;
    case UINT16:
      TemplatedListValueFunction<unsigned_short,duckdb::ListValueAssign>
                (in_stack_00000050,in_stack_00000048);
      break;
    case INT16:
      TemplatedListValueFunction<short,duckdb::ListValueAssign>(in_stack_00000050,in_stack_00000048)
      ;
      break;
    case UINT32:
      TemplatedListValueFunction<unsigned_int,duckdb::ListValueAssign>
                (in_stack_00000050,in_stack_00000048);
      break;
    case INT32:
      TemplatedListValueFunction<int,duckdb::ListValueAssign>(in_stack_00000050,in_stack_00000048);
      break;
    case UINT64:
      TemplatedListValueFunction<unsigned_long,duckdb::ListValueAssign>
                (in_stack_00000060,in_stack_00000058);
      break;
    case INT64:
      TemplatedListValueFunction<long,duckdb::ListValueAssign>(in_stack_00000060,in_stack_00000058);
      break;
    case FLOAT:
      TemplatedListValueFunction<float,duckdb::ListValueAssign>(in_stack_00000050,in_stack_00000048)
      ;
      break;
    case DOUBLE:
      TemplatedListValueFunction<double,duckdb::ListValueAssign>
                (in_stack_00000060,in_stack_00000058);
      break;
    case INTERVAL:
      TemplatedListValueFunction<duckdb::interval_t,duckdb::ListValueAssign>
                (in_stack_00000070,in_stack_00000068);
      break;
    case LIST:
      ListValueListFunction(in_stack_000001b0,in_stack_000001a8);
      break;
    case VARCHAR:
      TemplatedListValueFunction<duckdb::string_t,duckdb::ListValueStringAssign>
                (in_stack_00000070,in_stack_00000068);
      break;
    default:
      TemplatedListValueFunctionFallback(in_stack_00000080,in_stack_00000078);
      break;
    case UINT128:
      TemplatedListValueFunction<duckdb::uhugeint_t,duckdb::ListValueAssign>
                (in_stack_00000070,in_stack_00000068);
      break;
    case INT128:
      TemplatedListValueFunction<duckdb::hugeint_t,duckdb::ListValueAssign>
                (in_stack_00000070,in_stack_00000068);
    }
  }
  return;
}

Assistant:

static void ListValueFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(result.GetType().id() == LogicalTypeId::LIST);
	result.SetVectorType(VectorType::CONSTANT_VECTOR);
	if (args.ColumnCount() == 0) {
		// no columns - early out - result is a constant empty list
		auto result_data = FlatVector::GetData<list_entry_t>(result);
		result_data[0].length = 0;
		result_data[0].offset = 0;
		return;
	}
	for (idx_t i = 0; i < args.ColumnCount(); i++) {
		if (args.data[i].GetVectorType() != VectorType::CONSTANT_VECTOR) {
			result.SetVectorType(VectorType::FLAT_VECTOR);
		}
	}
	auto &result_type = ListVector::GetEntry(result).GetType();
	switch (result_type.InternalType()) {
	case PhysicalType::BOOL:
	case PhysicalType::INT8:
		TemplatedListValueFunction<int8_t>(args, result);
		break;
	case PhysicalType::INT16:
		TemplatedListValueFunction<int16_t>(args, result);
		break;
	case PhysicalType::INT32:
		TemplatedListValueFunction<int32_t>(args, result);
		break;
	case PhysicalType::INT64:
		TemplatedListValueFunction<int64_t>(args, result);
		break;
	case PhysicalType::UINT8:
		TemplatedListValueFunction<uint8_t>(args, result);
		break;
	case PhysicalType::UINT16:
		TemplatedListValueFunction<uint16_t>(args, result);
		break;
	case PhysicalType::UINT32:
		TemplatedListValueFunction<uint32_t>(args, result);
		break;
	case PhysicalType::UINT64:
		TemplatedListValueFunction<uint64_t>(args, result);
		break;
	case PhysicalType::INT128:
		TemplatedListValueFunction<hugeint_t>(args, result);
		break;
	case PhysicalType::UINT128:
		TemplatedListValueFunction<uhugeint_t>(args, result);
		break;
	case PhysicalType::FLOAT:
		TemplatedListValueFunction<float>(args, result);
		break;
	case PhysicalType::DOUBLE:
		TemplatedListValueFunction<double>(args, result);
		break;
	case PhysicalType::INTERVAL:
		TemplatedListValueFunction<interval_t>(args, result);
		break;
	case PhysicalType::VARCHAR:
		TemplatedListValueFunction<string_t, ListValueStringAssign>(args, result);
		break;
	case PhysicalType::LIST:
		ListValueListFunction(args, result);
		break;
	default: {
		TemplatedListValueFunctionFallback(args, result);
		break;
	}
	}
}